

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_chord_height(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  REF_INT cell;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  REF_DBL n1 [3];
  REF_DBL n0 [3];
  REF_INT nodes [27];
  double local_e8 [4];
  double local_c8 [3];
  int iStack_ac;
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[0];
  uVar8 = 0xffffffff;
  if (-1 < node1) {
    uVar8 = 0xffffffff;
    if (node1 < ref_cell->ref_adj->nnode) {
      uVar8 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar8 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar8].ref;
    do {
      uVar6 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x25a,"ref_collapse_edge_chord_height",(ulong)uVar6,"nodes");
        return uVar6;
      }
      if ((long)ref_cell->node_per < 1) {
LAB_0013eb03:
        if (0 < ref_cell->node_per) {
          lVar7 = 0;
          do {
            if (local_a8[lVar7] == node1) {
              pRVar3 = pRVar2->real;
              iVar1 = local_a8[1 - lVar7];
              lVar9 = 0;
              do {
                dVar11 = pRVar3[node0 * 0xf + lVar9];
                local_c8[lVar9] = pRVar3[node1 * 0xf + lVar9] - dVar11;
                local_e8[lVar9] = pRVar3[(long)iVar1 * 0xf + lVar9] - dVar11;
                dVar14 = local_e8[2];
                dVar13 = local_e8[1];
                dVar11 = local_e8[0];
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              dVar10 = local_e8[2] * local_e8[2] +
                       local_e8[0] * local_e8[0] + local_e8[1] * local_e8[1];
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              dVar12 = local_c8[1] * dVar14 - dVar13 * local_c8[2];
              dVar14 = local_c8[2] * dVar11 - dVar14 * local_c8[0];
              dVar11 = local_c8[0] * dVar13 - dVar11 * local_c8[1];
              dVar11 = dVar11 * dVar11 + dVar12 * dVar12 + dVar14 * dVar14;
              if (dVar11 < 0.0) {
                dVar11 = sqrt(dVar11);
              }
              else {
                dVar11 = SQRT(dVar11);
              }
              dVar13 = dVar10 * 1e+20;
              if (dVar13 <= -dVar13) {
                dVar13 = -dVar13;
              }
              dVar14 = dVar11;
              if (dVar11 <= -dVar11) {
                dVar14 = -dVar11;
              }
              if (dVar13 <= dVar14) {
                return 0;
              }
              dVar11 = dVar11 / dVar10;
              if (0.1 < dVar11 / dVar10) {
                return 0;
              }
              if (dVar11 <= -dVar11) {
                dVar11 = -dVar11;
              }
              if (dVar13 <= dVar11) {
                return 0;
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < ref_cell->node_per);
        }
      }
      else {
        lVar7 = 0;
        bVar5 = false;
        do {
          if (local_a8[lVar7] == node0) {
            bVar5 = true;
          }
          lVar7 = lVar7 + 1;
        } while (ref_cell->node_per != lVar7);
        if (!bVar5) goto LAB_0013eb03;
      }
      pRVar4 = ref_cell->ref_adj->item;
      iVar1 = pRVar4[(int)uVar8].next;
      uVar8 = (ulong)iVar1;
      if (uVar8 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar4[uVar8].ref;
      }
    } while (iVar1 != -1);
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_chord_height(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;
  REF_INT i;
  REF_DBL n0[3], n1[3], cross_prod[3];
  REF_DBL new_length, cross_length, chord, chord_ratio;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) {
        /* triangle node0, node1, nodes[node] */
        /* nodes[node] = node0; */
        for (i = 0; i < 3; i++) {
          n0[i] = ref_node_xyz(ref_node, i, node1) -
                  ref_node_xyz(ref_node, i, node0);
          n1[i] = ref_node_xyz(ref_node, i, nodes[1 - node]) -
                  ref_node_xyz(ref_node, i, node0);
        }
        new_length = sqrt(ref_math_dot(n1, n1));
        ref_math_cross_product(n0, n1, cross_prod);
        cross_length = sqrt(ref_math_dot(cross_prod, cross_prod));
        /* |n0 x n1| = |n0||n1|sin(t) */
        if (ref_math_divisible(cross_length, new_length)) {
          chord = cross_length / new_length;
          if (ref_math_divisible(chord, new_length)) {
            chord_ratio = chord / new_length;
            if (chord_ratio > 0.1) return REF_SUCCESS;
          } else {
            return REF_SUCCESS;
          }
        } else {
          return REF_SUCCESS;
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}